

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall CSourceFilesProcessor::processFile(CSourceFilesProcessor *this,string *fileName)

{
  bool bVar1;
  TErrorSeverity TVar2;
  ulong uVar3;
  long *plVar4;
  allocator local_41;
  string local_40 [39];
  char local_19;
  string *psStack_18;
  char c;
  string *fileName_local;
  CSourceFilesProcessor *this_local;
  
  psStack_18 = fileName;
  fileName_local = (string *)this;
  std::ifstream::open(&this->file,fileName,8);
  Refal2::CError::SetFileName((CError *)&this->scanner,psStack_18);
  uVar3 = std::ios::good();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"no such file",&local_41);
    Refal2::CErrorsHelper::RaiseError
              ((CErrorsHelper *)&this->scanner,ES_FatalError,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    while( true ) {
      plVar4 = (long *)std::istream::get((char *)&this->file);
      bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if (!bVar1) break;
      Refal2::CScanner::AddChar(&this->scanner,local_19);
    }
    TVar2 = Refal2::CErrorsHelper::ErrorSeverity((CErrorsHelper *)&this->scanner);
    if (TVar2 != ES_FatalError) {
      Refal2::CScanner::AddEndOfFile(&this->scanner);
    }
  }
  Refal2::CError::ResetFileName((CError *)&this->scanner);
  std::ifstream::close();
  return;
}

Assistant:

void CSourceFilesProcessor::processFile( const std::string& fileName )
{
	file.open( fileName );
	scanner.SetFileName( fileName );
	if( file.good() ) {
		for( char c; file.get( c ); ) {
			scanner.AddChar( c );
		}
		if( scanner.ErrorSeverity() != ES_FatalError ) {
			scanner.AddEndOfFile();
		}
	} else {
		scanner.RaiseError( ES_FatalError, "no such file" );
	}
	scanner.ResetFileName();
	file.close();
}